

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManFlowFindBestCut(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,int Num)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Ptr_t *vCone;
  Vec_Ptr_t *vSet;
  Aig_Man_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  Aig_Man_t *p_00;
  int local_68;
  int local_64;
  int local_5c;
  
  uVar2 = (long)(p->nObjs[6] + p->nObjs[5]) / (long)Num;
  iVar5 = Llb_ManCutVolume(p,vLower,vUpper);
  iVar11 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 2);
  iVar6 = iVar5 - iVar11;
  if (iVar6 == 0 || iVar5 < iVar11) {
    __assert_fail("Vol > nVolMin",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                  ,0x48c,
                  "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)");
  }
  if (iVar11 < iVar6) {
    iVar6 = iVar11;
  }
  vCone = Vec_PtrAlloc(100);
  vSet = Vec_PtrAlloc(100);
  pAVar9 = p;
  Llb_ManFlowPrepareCut(p,vLower,vUpper);
  local_64 = 0;
  local_5c = 1000000000;
  local_68 = -1;
  iVar5 = 1;
  do {
    if (p->nRegs <= iVar5) {
      if (local_68 != -1) {
        __assert_fail("iBest >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                      ,0x4b4,
                      "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)"
                     );
      }
      pVVar10 = (Vec_Ptr_t *)0x0;
LAB_006a357f:
      Vec_PtrFree(vCone);
      Vec_PtrFree(vSet);
      return pVVar10;
    }
    for (iVar11 = 0; iVar11 < vLower->nSize; iVar11 = iVar11 + 1) {
      pAVar9 = (Aig_Man_t *)vLower;
      Vec_PtrEntry(vLower,iVar11);
      Llb_ManFlowGetObjSet(pAVar9,vLower,iVar11,iVar5,vSet);
      pAVar9 = p;
      Llb_ManFlowCollectAndMarkCone(p,vSet,vCone);
      if (vCone->nSize != 0) {
        p_00 = p;
        pAVar9 = (Aig_Man_t *)Llb_ManFlowCompute(p);
        Llb_ManFlowUnmarkCone(p_00,vCone);
        iVar7 = Llb_ManCutVolume(p,vLower,(Vec_Ptr_t *)pAVar9);
        iVar8 = Llb_ManCutVolume(p,(Vec_Ptr_t *)pAVar9,vUpper);
        if (iVar7 < iVar8) {
          iVar8 = iVar7;
        }
        iVar7 = local_68;
        iVar3 = local_64;
        iVar4 = local_5c;
        if (((iVar6 <= iVar8) &&
            (iVar1 = *(int *)((long)&pAVar9->pName + 4), iVar7 = iVar11, iVar3 = iVar8,
            iVar4 = iVar1, local_5c <= iVar1 && local_5c != -1)) &&
           (iVar4 = local_5c, local_5c != iVar1 || iVar8 <= local_64)) {
          iVar7 = local_68;
          iVar3 = local_64;
        }
        local_5c = iVar4;
        local_64 = iVar3;
        local_68 = iVar7;
        Vec_PtrFree((Vec_Ptr_t *)pAVar9);
      }
    }
    if (-1 < local_68) {
      Llb_ManFlowGetObjSet(pAVar9,vLower,local_68,iVar5,vSet);
      Llb_ManFlowCollectAndMarkCone(p,vSet,vCone);
      pVVar10 = Llb_ManFlowCompute(p);
      Llb_ManFlowUnmarkCone(p,vCone);
      goto LAB_006a357f;
    }
    iVar5 = iVar5 + 5;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManFlowFindBestCut( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, int Num )
{
    int nVolMin = Aig_ManNodeNum(p) / Num / 2;
    Vec_Ptr_t * vMinCut;
    Vec_Ptr_t * vCone, * vSet;
    Aig_Obj_t * pObj;
    int i, s, Vol, VolLower, VolUpper, VolCmp;
    int iBest = -1, iMinCut = ABC_INFINITY, iVolBest = 0;

    Vol = Llb_ManCutVolume( p, vLower, vUpper );
    assert( Vol > nVolMin );
    VolCmp = Abc_MinInt( nVolMin, Vol - nVolMin );
    vCone = Vec_PtrAlloc( 100 );
    vSet  = Vec_PtrAlloc( 100 );
    Llb_ManFlowPrepareCut( p, vLower, vUpper );
    for ( s = 1; s < Aig_ManRegNum(p); s += 5 )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        {
            Llb_ManFlowGetObjSet( p, vLower, i, s, vSet );
            Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
            if ( Vec_PtrSize(vCone) == 0 )
                continue;
            vMinCut  = Llb_ManFlowCompute( p );
            Llb_ManFlowUnmarkCone( p, vCone );

            VolLower = Llb_ManCutVolume( p, vLower, vMinCut );
            VolUpper = Llb_ManCutVolume( p, vMinCut, vUpper );
            Vol = Abc_MinInt( VolLower, VolUpper );
            if ( Vol >= VolCmp &&  (iMinCut == -1 || 
                                    iMinCut >  Vec_PtrSize(vMinCut) || 
                                   (iMinCut == Vec_PtrSize(vMinCut) && iVolBest < Vol)) )
            {
                iBest = i;
                iMinCut = Vec_PtrSize(vMinCut);
                iVolBest = Vol;
            }
            Vec_PtrFree( vMinCut );
        }
        if ( iBest >= 0 )
            break;
    }
    if ( iBest == -1 )
    {
        // cleanup
        Vec_PtrFree( vCone );
        Vec_PtrFree( vSet );
        return NULL;
    }
    // get the best cut
    assert( iBest >= 0 );
    Llb_ManFlowGetObjSet( p, vLower, iBest, s, vSet );
    Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
    vMinCut = Llb_ManFlowCompute( p );
    Llb_ManFlowUnmarkCone( p, vCone );
    // cleanup
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSet );
    return vMinCut;
}